

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O3

uint aom_variance128x128_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [32];
  int iVar18;
  int iVar19;
  undefined1 (*pauVar20) [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  pauVar17 = (undefined1 (*) [32])(src + 0x60);
  pauVar15 = (undefined1 (*) [32])(ref + 0x60);
  auVar21 = ZEXT1664((undefined1  [16])0x0);
  iVar18 = 0;
  auVar22._8_2_ = 0xff01;
  auVar22._0_8_ = 0xff01ff01ff01ff01;
  auVar22._10_2_ = 0xff01;
  auVar22._12_2_ = 0xff01;
  auVar22._14_2_ = 0xff01;
  auVar22._16_2_ = 0xff01;
  auVar22._18_2_ = 0xff01;
  auVar22._20_2_ = 0xff01;
  auVar22._22_2_ = 0xff01;
  auVar22._24_2_ = 0xff01;
  auVar22._26_2_ = 0xff01;
  auVar22._28_2_ = 0xff01;
  auVar22._30_2_ = 0xff01;
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  do {
    iVar19 = 0x10;
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    pauVar16 = pauVar15;
    pauVar20 = pauVar17;
    do {
      auVar12 = vpunpcklbw_avx2(pauVar20[-3],pauVar16[-3]);
      auVar10 = vpunpckhbw_avx2(pauVar20[-3],pauVar16[-3]);
      auVar4 = vpmaddubsw_avx2(auVar12,auVar22);
      auVar5 = vpmaddubsw_avx2(auVar10,auVar22);
      auVar10 = vpmaddwd_avx2(auVar4,auVar4);
      auVar10 = vpaddd_avx2(auVar10,auVar23._0_32_);
      auVar12 = vpmaddwd_avx2(auVar5,auVar5);
      auVar13 = vpunpcklbw_avx2(pauVar20[-2],pauVar16[-2]);
      auVar11 = vpunpckhbw_avx2(pauVar20[-2],pauVar16[-2]);
      auVar13 = vpmaddubsw_avx2(auVar13,auVar22);
      auVar6 = vpmaddubsw_avx2(auVar11,auVar22);
      auVar11 = vpmaddwd_avx2(auVar13,auVar13);
      auVar12 = vpaddd_avx2(auVar12,auVar11);
      auVar10 = vpaddd_avx2(auVar12,auVar10);
      auVar12 = vpmaddwd_avx2(auVar6,auVar6);
      auVar14 = vpunpcklbw_avx2(pauVar20[-1],pauVar16[-1]);
      auVar11 = vpunpckhbw_avx2(pauVar20[-1],pauVar16[-1]);
      auVar14 = vpmaddubsw_avx2(auVar14,auVar22);
      auVar7 = vpmaddubsw_avx2(auVar11,auVar22);
      auVar11 = vpmaddwd_avx2(auVar14,auVar14);
      auVar12 = vpaddd_avx2(auVar12,auVar11);
      auVar11 = vpmaddwd_avx2(auVar7,auVar7);
      auVar12 = vpaddd_avx2(auVar12,auVar11);
      auVar10 = vpaddd_avx2(auVar12,auVar10);
      auVar11 = vpunpcklbw_avx2(*pauVar20,*pauVar16);
      auVar12 = vpunpckhbw_avx2(*pauVar20,*pauVar16);
      auVar8 = vpmaddubsw_avx2(auVar11,auVar22);
      auVar9 = vpmaddubsw_avx2(auVar12,auVar22);
      auVar12 = vpmaddwd_avx2(auVar8,auVar8);
      auVar11 = vpmaddwd_avx2(auVar9,auVar9);
      auVar12 = vpaddd_avx2(auVar12,auVar11);
      auVar11 = vpaddd_avx2(auVar12,auVar10);
      auVar23 = ZEXT3264(auVar11);
      auVar10 = vpaddw_avx2(auVar4,auVar24._0_32_);
      auVar12 = vpaddw_avx2(auVar13,auVar5);
      auVar10 = vpaddw_avx2(auVar10,auVar12);
      auVar12 = vpaddw_avx2(auVar14,auVar6);
      auVar12 = vpaddw_avx2(auVar12,auVar7);
      auVar10 = vpaddw_avx2(auVar10,auVar12);
      auVar12 = vpaddw_avx2(auVar8,auVar9);
      auVar10 = vpaddw_avx2(auVar10,auVar12);
      auVar24 = ZEXT3264(auVar10);
      pauVar20 = (undefined1 (*) [32])(*pauVar20 + src_stride);
      pauVar16 = (undefined1 (*) [32])(*pauVar16 + ref_stride);
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
    auVar12 = vpmovsxwd_avx2(auVar10._0_16_);
    auVar12 = vpaddd_avx2(auVar21._0_32_,auVar12);
    auVar10 = vpmovsxwd_avx2(auVar10._16_16_);
    auVar10 = vpaddd_avx2(auVar12,auVar10);
    auVar21 = ZEXT3264(auVar10);
    iVar18 = iVar18 + 1;
    pauVar17 = (undefined1 (*) [32])(*pauVar17 + (src_stride << 4));
    pauVar15 = (undefined1 (*) [32])(*pauVar15 + (ref_stride << 4));
  } while (iVar18 != 8);
  auVar1 = vpaddd_avx(auVar10._16_16_,auVar10._0_16_);
  auVar2 = vpaddd_avx(auVar11._16_16_,auVar11._0_16_);
  auVar3 = vpunpckldq_avx(auVar2,auVar1);
  auVar1 = vpunpckhdq_avx(auVar2,auVar1);
  auVar1 = vpaddd_avx(auVar3,auVar1);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  *sse = auVar1._0_4_;
  return auVar1._0_4_ - (int)((ulong)((long)auVar1._4_4_ * (long)auVar1._4_4_) >> 0xe);
}

Assistant:

unsigned int aom_mse16x16_avx2(const uint8_t *src, int src_stride,
                               const uint8_t *ref, int ref_stride,
                               unsigned int *sse) {
  aom_variance16x16_avx2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}